

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[384]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [384])

{
  undefined4 in_register_00000014;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_ffffffffffffff28;
  ArrayDisposer **local_a0;
  undefined1 local_48 [8];
  String argValues [1];
  char (*params_local) [384];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  str<char_const(&)[384]>
            ((String *)local_48,(kj *)params,(char (*) [384])CONCAT44(in_register_00000014,severity)
            );
  AVar1 = arrayPtr<kj::String>((String *)local_48,1);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_ffffffffffffff28);
  local_a0 = &argValues[0].content.disposer;
  do {
    local_a0 = local_a0 + -3;
    String::~String((String *)local_a0);
  } while (local_a0 != (ArrayDisposer **)local_48);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}